

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsSceneBspTree::rectForIndex(QGraphicsSceneBspTree *this,int index)

{
  int iVar1;
  const_reference pNVar2;
  uint in_EDX;
  QGraphicsSceneBspTree *in_RSI;
  QRectF *in_RDI;
  Node *parent;
  int parentIdx;
  qsizetype in_stack_ffffffffffffffc8;
  QRectF *this_00;
  undefined8 in_stack_ffffffffffffffe8;
  int index_00;
  
  index_00 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if ((int)in_EDX < 1) {
    in_RDI->xp = (in_RSI->rect).xp;
    in_RDI->yp = (in_RSI->rect).yp;
    in_RDI->w = (in_RSI->rect).w;
    in_RDI->h = (in_RSI->rect).h;
  }
  else {
    this_00 = in_RDI;
    iVar1 = parentIndex(in_RSI,in_EDX);
    this_00->xp = -NAN;
    this_00->yp = -NAN;
    this_00->w = -NAN;
    this_00->h = -NAN;
    rectForIndex((QGraphicsSceneBspTree *)CONCAT44(in_EDX,iVar1),index_00);
    pNVar2 = QList<QGraphicsSceneBspTree::Node>::at
                       ((QList<QGraphicsSceneBspTree::Node> *)this_00,in_stack_ffffffffffffffc8);
    if (pNVar2->type == Vertical) {
      if ((in_EDX & 1) == 0) {
        QRectF::setLeft(this_00,(pNVar2->field_0).offset);
      }
      else {
        QRectF::setRight(this_00,(pNVar2->field_0).offset);
      }
    }
    else if ((in_EDX & 1) == 0) {
      QRectF::setTop(this_00,(pNVar2->field_0).offset);
    }
    else {
      QRectF::setBottom(this_00,(pNVar2->field_0).offset);
    }
  }
  return in_RDI;
}

Assistant:

QRectF QGraphicsSceneBspTree::rectForIndex(int index) const
{
    if (index <= 0)
        return rect;

    int parentIdx = parentIndex(index);
    QRectF rect = rectForIndex(parentIdx);
    const Node *parent = &nodes.at(parentIdx);

    if (parent->type == Node::Vertical) {
        if (index & 1)
            rect.setRight(parent->offset);
        else
            rect.setLeft(parent->offset);
    } else {
        if (index & 1)
            rect.setBottom(parent->offset);
        else
            rect.setTop(parent->offset);
    }

    return rect;
}